

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

bool __thiscall
Fossilize::DatabaseInterface::Impl::parse_imported_metadata(Impl *this,void *data_,size_t size_)

{
  Impl *pIVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  ulong uVar6;
  ExportedMetadataHeader *pEVar7;
  ExportedMetadataHeader *local_60;
  ExportedMetadataHeader *header;
  Impl *local_50;
  vector<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
  headers;
  
  headers.
  super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  headers.
  super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  headers.
  super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar3 = 0;
  do {
    uVar2 = uVar3;
    if ((size_ < uVar2 + 0xb0) ||
       (uVar3 = *(long *)((long)data_ + uVar2 + 8) + uVar2, size_ < uVar3)) break;
  } while ((*(long *)((long)data_ + uVar2) == 0xb10bf05511153) ||
          (*(long *)((long)data_ + uVar2) == 0xb10b5f05511153));
  if (uVar2 < 0xb0) {
LAB_001053e6:
    bVar5 = false;
  }
  else {
    if (*data_ == 0xb10b5f05511153) {
      uVar2 = uVar2 - *(long *)((long)data_ + 8);
      pEVar7 = (ExportedMetadataHeader *)((long)data_ + *(long *)((long)data_ + 8));
      local_60 = (ExportedMetadataHeader *)data_;
    }
    else {
      local_60 = (ExportedMetadataHeader *)0x0;
      pEVar7 = (ExportedMetadataHeader *)data_;
    }
    local_50 = this;
    while( true ) {
      pIVar1 = local_50;
      lVar4 = 0x18;
      if (uVar2 == 0) break;
      if ((uVar2 < 0xb0) || (header = pEVar7, pEVar7->magic != 0xb10bf05511153)) goto LAB_001053e6;
      uVar3 = pEVar7->size;
      uVar6 = uVar3;
      while( true ) {
        if (uVar2 < uVar6) goto LAB_001053e6;
        if (lVar4 == 0xb8) break;
        uVar6 = *(long *)((long)&((ExportedMetadataHeader *)(pEVar7->lists + -1))->magic + lVar4) *
                0x20 + *(long *)((long)pEVar7->lists + lVar4 + -0x18);
        lVar4 = lVar4 + 0x10;
      }
      std::
      vector<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
      ::push_back(&headers,&header);
      uVar2 = uVar2 - uVar3;
      pEVar7 = (ExportedMetadataHeader *)
               ((long)&((ExportedMetadataHeader *)(pEVar7->lists + -1))->magic + uVar3);
    }
    if (local_50->mapped_metadata != (uint8_t *)0x0) {
      munmap(local_50->mapped_metadata,local_50->mapped_metadata_size);
    }
    pIVar1->mapped_metadata = (uint8_t *)data_;
    pIVar1->mapped_metadata_size = size_;
    std::
    vector<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
    ::_M_move_assign(&pIVar1->imported_metadata,&headers);
    pIVar1->imported_concurrent_metadata = local_60;
    bVar5 = true;
  }
  std::
  _Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
  ::~_Vector_base(&headers.
                   super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
                 );
  return bVar5;
}

Assistant:

bool DatabaseInterface::Impl::parse_imported_metadata(const void *data_, size_t size_)
{
	std::vector<const ExportedMetadataHeader *> headers;
	auto *data = static_cast<const uint8_t *>(data_);

	// Imported size might be rounded up to page size, so find exact bound first.
	size_t size = deduce_imported_size(data_, size_);

	if (size < sizeof(ExportedMetadataHeader))
		return false;

	auto *concurrent_header = reinterpret_cast<const ExportedMetadataHeader *>(data);
	if (concurrent_header->magic == ExportedMetadataMagicConcurrent)
	{
		data += concurrent_header->size;
		size -= concurrent_header->size;
	}
	else
		concurrent_header = nullptr;

	while (size != 0)
	{
		if (size < sizeof(ExportedMetadataHeader))
			return false;

		auto *header = reinterpret_cast<const ExportedMetadataHeader *>(data);
		if (header->magic != ExportedMetadataMagic)
			return false;
		if (header->size > size)
			return false;

		for (auto &list : header->lists)
			if (list.offset + list.count * sizeof(ExportedMetadataBlock) > size)
				return false;

		data += header->size;
		size -= header->size;
		headers.push_back(header);
	}

#ifdef _WIN32
	if (mapped_metadata)
		UnmapViewOfFile(mapped_metadata);
#else
	if (mapped_metadata)
		munmap(const_cast<uint8_t *>(mapped_metadata), mapped_metadata_size);
#endif
	mapped_metadata = static_cast<const uint8_t *>(data_);
	mapped_metadata_size = size_;
	imported_metadata = std::move(headers);
	imported_concurrent_metadata = concurrent_header;
	return true;
}